

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

bool __thiscall pbrt::SquareMatrix<2>::operator<(SquareMatrix<2> *this,SquareMatrix<2> *m2)

{
  bool bVar1;
  long lVar2;
  byte in_DL;
  bool bVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  
  lVar2 = 0;
  do {
    fVar5 = this->m[lVar2][0];
    fVar6 = m2->m[lVar2][0];
    if (fVar6 <= fVar5) {
      bVar1 = false;
      bVar4 = false;
      do {
        bVar3 = bVar1;
        if ((fVar6 < fVar5) || (bVar3 != false)) {
          if (fVar6 < fVar5) {
            bVar3 = bVar4;
          }
          bVar1 = (bool)(fVar5 <= fVar6 & in_DL);
          break;
        }
        fVar5 = this->m[lVar2][1];
        fVar6 = m2->m[lVar2][1];
        bVar1 = true;
        bVar4 = bVar3;
      } while (fVar6 <= fVar5);
    }
    else {
      bVar1 = true;
      bVar3 = false;
    }
    if (bVar3 == false) {
      return bVar1;
    }
    bVar4 = lVar2 != 0;
    lVar2 = lVar2 + 1;
    in_DL = bVar1;
    if (bVar4) {
      return false;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool operator<(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j) {
                if (m[i][j] < m2.m[i][j])
                    return true;
                if (m[i][j] > m2.m[i][j])
                    return false;
            }
        return false;
    }